

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

void __thiscall inja::Renderer::pop_args(Renderer *this,Bytecode *bc)

{
  uint local_20;
  uint local_1c;
  uint i;
  uint popArgs;
  Bytecode *bc_local;
  Renderer *this_local;
  
  local_1c = *(uint *)&bc->field_0x4 & 0x3fffffff;
  if (*(uint *)&bc->field_0x4 >> 0x1e != 0) {
    local_1c = local_1c - 1;
  }
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    std::
    vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ::pop_back(&this->m_stack);
  }
  return;
}

Assistant:

void pop_args(const Bytecode& bc) {
    unsigned int popArgs = bc.args;
    if ((bc.flags & Bytecode::Flag::ValueMask) != Bytecode::Flag::ValuePop) {
      popArgs -= 1;
    }
    for (unsigned int i = 0; i < popArgs; ++i) {
      m_stack.pop_back();
    }
  }